

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::PathPtr::clone(PathPtr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_t count;
  String *pSVar1;
  ArrayDisposer *pAVar2;
  String *pSVar3;
  long lVar4;
  String *value;
  ArrayBuilder<kj::String> builder;
  Array<char> local_68;
  Array<kj::String> local_48;
  
  count = *(size_t *)(__fn + 8);
  builder.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  builder.endPtr = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pSVar3 = *(String **)__fn;
  builder.pos = builder.ptr;
  for (value = pSVar3; pAVar2 = builder.disposer, pSVar1 = builder.ptr,
      value != pSVar3 + *(long *)(__fn + 8); value = value + 1) {
    heapString((String *)&local_68,value);
    ((builder.pos)->content).ptr = local_68.ptr;
    ((builder.pos)->content).size_ = local_68.size_;
    ((builder.pos)->content).disposer = local_68.disposer;
    local_68.ptr = (char *)0x0;
    local_68.size_ = 0;
    builder.pos = builder.pos + 1;
    Array<char>::~Array(&local_68);
    pSVar3 = *(String **)__fn;
  }
  lVar4 = (long)builder.pos - (long)builder.ptr;
  local_48.disposer = builder.disposer;
  builder.ptr = (String *)0x0;
  builder.pos = (RemoveConst<kj::String> *)0x0;
  builder.endPtr = (String *)0x0;
  ArrayBuilder<kj::String>::dispose(&builder);
  (this->parts).ptr = pSVar1;
  (this->parts).size_ = lVar4 / 0x18;
  this[1].parts.ptr = (String *)pAVar2;
  local_48.ptr = (String *)0x0;
  local_48.size_ = 0;
  Array<kj::String>::~Array(&local_48);
  return (int)this;
}

Assistant:

Path PathPtr::clone() {
  return Path(KJ_MAP(p, parts) { return heapString(p); }, Path::ALREADY_CHECKED);
}